

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.h
# Opt level: O2

bool __thiscall
Clasp::Asp::LogicProgram::checkBody
          (LogicProgram *this,PrgBody *rhs,Body_t type,uint32 size,weight_t bound)

{
  PrgNode PVar1;
  weight_t wVar2;
  Id_t IVar3;
  
  PVar1 = rhs->super_PrgNode;
  if (((((ulong)PVar1 >> 0x3e & 1) == 0) ||
      (((~(ulong)PVar1 & 0xfffffff00000000) != 0 &&
       (IVar3 = getEqBody(this,PVar1._4_4_ & 0xfffffff),
       ((ulong)(this->bodies_).ebo_.buf[IVar3]->super_PrgNode & 0x4000000000000000) == 0)))) &&
     ((*(uint *)&rhs->field_0x8 & 0x1ffffff) == size &&
      (*(uint *)&rhs->field_0x8 >> 0x1b & __eEnd) == type.val_)) {
    wVar2 = PrgBody::bound(rhs);
    return wVar2 == bound;
  }
  return false;
}

Assistant:

bool checkBody(const PrgBody& rhs, Body_t type, uint32 size, weight_t bound) const {
		return (rhs.relevant() || (rhs.eq() && getBody(getEqBody(rhs.id()))->relevant()))
			&& rhs.type() == type && rhs.size() == size && rhs.bound() == bound;
	}